

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmcoll.cpp
# Opt level: O3

int __thiscall
CVmObjCollection::getp_create_live_iter
          (CVmObjCollection *this,vm_val_t *retval,vm_val_t *self_val,uint *argc)

{
  undefined4 uVar1;
  vm_obj_id_t vVar2;
  undefined4 uVar3;
  vm_datatype_t *pvVar4;
  vm_val_t *pvVar5;
  int iVar6;
  
  if (getp_create_live_iter(vm_val_t*,vm_val_t_const*,unsigned_int*)::desc == '\0') {
    getp_create_live_iter();
  }
  iVar6 = CVmObject::get_prop_check_argc(retval,argc,&getp_create_live_iter::desc);
  pvVar5 = sp_;
  if (iVar6 == 0) {
    uVar1 = *(undefined4 *)&self_val->field_0x4;
    vVar2 = (self_val->val).obj;
    uVar3 = *(undefined4 *)((long)&self_val->val + 4);
    pvVar4 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar4 = self_val->typ;
    *(undefined4 *)&pvVar5->field_0x4 = uVar1;
    (pvVar5->val).obj = vVar2;
    *(undefined4 *)((long)&pvVar5->val + 4) = uVar3;
    (*(this->super_CVmObject)._vptr_CVmObject[0x3c])(this,retval,self_val);
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjCollection::getp_create_live_iter(VMG_ vm_val_t *retval,
                                            const vm_val_t *self_val,
                                            uint *argc)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* push a self-reference for gc protection */
    G_stk->push(self_val);

    /* create the "live" iterator */
    new_live_iterator(vmg_ retval, self_val);

    /* discard the gc protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}